

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DARKEN_AREA(effect_handler_context_t_conflict *context)

{
  player_state_conflict state;
  byte bVar1;
  player *p;
  _Bool _Var2;
  uint32_t uVar3;
  monster *mon_00;
  loc grid2;
  long lVar4;
  player_state_conflict *ppVar5;
  undefined8 *puVar6;
  bool bVar7;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 in_stack_fffffffffffffe18 [312];
  char local_98 [8];
  char m_name [80];
  _Bool decoy_unseen;
  loc_conflict decoy;
  monster *t_mon;
  monster *mon;
  loc lStack_18;
  _Bool message;
  loc_conflict target;
  effect_handler_context_t_conflict *context_local;
  
  bVar8 = 0;
  lStack_18 = player->grid;
  bVar7 = player->timed[2] == 0;
  t_mon = (monster *)0x0;
  mon_00 = monster_target_monster(context);
  grid2 = cave_find_decoy(cave);
  bVar1 = 0;
  if ((context->origin).what == SRC_MONSTER) {
    t_mon = (monster *)cave_monster(cave,(context->origin).which.monster);
  }
  if (mon_00 != (monster *)0x0) {
    lStack_18 = mon_00->grid;
    monster_desc(local_98,0x50,mon_00,L'\x15');
    if (bVar7) {
      msg("Darkness surrounds %s.");
    }
    bVar7 = false;
  }
  if ((t_mon != (monster *)0x0) && (_Var2 = monster_is_decoyed(t_mon), _Var2)) {
    _Var2 = los(cave,player->grid,grid2);
    if ((!_Var2) || (player->timed[2] != 0)) {
      bVar1 = 1;
    }
    lStack_18 = grid2;
    if ((bVar7) && (bVar1 == 0)) {
      msg("Darkness surrounds the decoy.");
      bVar7 = false;
    }
  }
  if (bVar7) {
    msg("Darkness surrounds you.");
  }
  light_room(lStack_18,false);
  if ((context->origin).what == SRC_PLAYER) {
    ppVar5 = &player->state;
    puVar6 = (undefined8 *)&stack0xfffffffffffffe18;
    for (lVar4 = 0x27; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *(undefined8 *)ppVar5->stat_add;
      ppVar5 = (player_state_conflict *)((long)ppVar5 + (ulong)bVar8 * -0x10 + 8);
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    }
    state._312_4_ = *(undefined4 *)&(player->state).el_info[0x1b].flags;
    uVar9 = in_stack_fffffffffffffe18._202_4_;
    uVar10 = in_stack_fffffffffffffe18._206_4_;
    uVar11 = in_stack_fffffffffffffe18._210_4_;
    uVar12 = in_stack_fffffffffffffe18._214_4_;
    uVar13 = in_stack_fffffffffffffe18._218_4_;
    uVar14 = in_stack_fffffffffffffe18._222_4_;
    uVar15 = in_stack_fffffffffffffe18._226_4_;
    uVar16 = in_stack_fffffffffffffe18._230_4_;
    uVar17 = in_stack_fffffffffffffe18._234_4_;
    uVar18 = in_stack_fffffffffffffe18._238_4_;
    uVar19 = in_stack_fffffffffffffe18._242_4_;
    uVar20 = in_stack_fffffffffffffe18._246_4_;
    uVar21 = in_stack_fffffffffffffe18._250_4_;
    uVar22 = in_stack_fffffffffffffe18._254_4_;
    uVar23 = in_stack_fffffffffffffe18._258_4_;
    uVar24 = in_stack_fffffffffffffe18._262_4_;
    uVar25 = in_stack_fffffffffffffe18._266_4_;
    uVar26 = in_stack_fffffffffffffe18._270_4_;
    uVar27 = in_stack_fffffffffffffe18._274_4_;
    uVar28 = in_stack_fffffffffffffe18._278_4_;
    uVar29 = in_stack_fffffffffffffe18._282_4_;
    uVar30 = in_stack_fffffffffffffe18._286_4_;
    uVar31 = in_stack_fffffffffffffe18._290_4_;
    uVar32 = in_stack_fffffffffffffe18._294_4_;
    uVar33 = in_stack_fffffffffffffe18._298_4_;
    uVar34 = in_stack_fffffffffffffe18._302_4_;
    uVar35 = in_stack_fffffffffffffe18._306_4_;
    state.stat_add[0] = in_stack_fffffffffffffe18._0_4_;
    state.stat_add[1] = in_stack_fffffffffffffe18._4_4_;
    state.stat_add[2] = in_stack_fffffffffffffe18._8_4_;
    state.stat_add[3] = in_stack_fffffffffffffe18._12_4_;
    state.stat_add[4] = in_stack_fffffffffffffe18._16_4_;
    state.stat_ind[0] = in_stack_fffffffffffffe18._20_4_;
    state.stat_ind[1] = in_stack_fffffffffffffe18._24_4_;
    state.stat_ind[2] = in_stack_fffffffffffffe18._28_4_;
    state.stat_ind[3] = in_stack_fffffffffffffe18._32_4_;
    state.stat_ind[4] = in_stack_fffffffffffffe18._36_4_;
    state.stat_use[0] = in_stack_fffffffffffffe18._40_4_;
    state.stat_use[1] = in_stack_fffffffffffffe18._44_4_;
    state.stat_use[2] = in_stack_fffffffffffffe18._48_4_;
    state.stat_use[3] = in_stack_fffffffffffffe18._52_4_;
    state.stat_use[4] = in_stack_fffffffffffffe18._56_4_;
    state.stat_top[0] = in_stack_fffffffffffffe18._60_4_;
    state.stat_top[1] = in_stack_fffffffffffffe18._64_4_;
    state.stat_top[2] = in_stack_fffffffffffffe18._68_4_;
    state.stat_top[3] = in_stack_fffffffffffffe18._72_4_;
    state.stat_top[4] = in_stack_fffffffffffffe18._76_4_;
    state.skills[0] = in_stack_fffffffffffffe18._80_4_;
    state.skills[1] = in_stack_fffffffffffffe18._84_4_;
    state.skills[2] = in_stack_fffffffffffffe18._88_4_;
    state.skills[3] = in_stack_fffffffffffffe18._92_4_;
    state.skills[4] = in_stack_fffffffffffffe18._96_4_;
    state.skills[5] = in_stack_fffffffffffffe18._100_4_;
    state.skills[6] = in_stack_fffffffffffffe18._104_4_;
    state.skills[7] = in_stack_fffffffffffffe18._108_4_;
    state.skills[8] = in_stack_fffffffffffffe18._112_4_;
    state.skills[9] = in_stack_fffffffffffffe18._116_4_;
    state.speed = in_stack_fffffffffffffe18._120_4_;
    state.num_blows = in_stack_fffffffffffffe18._124_4_;
    state.num_shots = in_stack_fffffffffffffe18._128_4_;
    state.num_moves = in_stack_fffffffffffffe18._132_4_;
    state.ammo_mult = in_stack_fffffffffffffe18._136_4_;
    state.ammo_tval = in_stack_fffffffffffffe18._140_4_;
    state.ac = in_stack_fffffffffffffe18._144_4_;
    state.dam_red = in_stack_fffffffffffffe18._148_4_;
    state.perc_dam_red = in_stack_fffffffffffffe18._152_4_;
    state.to_a = in_stack_fffffffffffffe18._156_4_;
    state.to_h = in_stack_fffffffffffffe18._160_4_;
    state.to_d = in_stack_fffffffffffffe18._164_4_;
    state.see_infra = in_stack_fffffffffffffe18._168_4_;
    state.cur_light = in_stack_fffffffffffffe18._172_4_;
    state.evasion_chance = in_stack_fffffffffffffe18._176_4_;
    state.shield_on_back = (_Bool)in_stack_fffffffffffffe18[0xb4];
    state.heavy_wield = (_Bool)in_stack_fffffffffffffe18[0xb5];
    state.heavy_shoot = (_Bool)in_stack_fffffffffffffe18[0xb6];
    state.bless_wield = (_Bool)in_stack_fffffffffffffe18[0xb7];
    state.cumber_armor = (_Bool)in_stack_fffffffffffffe18[0xb8];
    state.flags[0] = in_stack_fffffffffffffe18[0xb9];
    state.flags[1] = in_stack_fffffffffffffe18[0xba];
    state.flags[2] = in_stack_fffffffffffffe18[0xbb];
    state.flags[3] = in_stack_fffffffffffffe18[0xbc];
    state.flags[4] = in_stack_fffffffffffffe18[0xbd];
    state.flags[5] = in_stack_fffffffffffffe18[0xbe];
    state.pflags[0] = in_stack_fffffffffffffe18[0xbf];
    state.pflags[1] = in_stack_fffffffffffffe18[0xc0];
    state.pflags[2] = in_stack_fffffffffffffe18[0xc1];
    state.pflags[3] = in_stack_fffffffffffffe18[0xc2];
    state.pflags[4] = in_stack_fffffffffffffe18[0xc3];
    state.pflags[5] = in_stack_fffffffffffffe18[0xc4];
    state.pflags[6] = in_stack_fffffffffffffe18[0xc5];
    state.pflags[7] = in_stack_fffffffffffffe18[0xc6];
    state.pflags[8] = in_stack_fffffffffffffe18[199];
    state.pflags[9] = in_stack_fffffffffffffe18[200];
    state._201_1_ = in_stack_fffffffffffffe18[0xc9];
    state.el_info[0].res_level = (short)uVar9;
    state.el_info[0].flags = (char)((uint)uVar9 >> 0x10);
    state.el_info[0]._3_1_ = (char)((uint)uVar9 >> 0x18);
    state.el_info[1].res_level = (short)uVar10;
    state.el_info[1].flags = (char)((uint)uVar10 >> 0x10);
    state.el_info[1]._3_1_ = (char)((uint)uVar10 >> 0x18);
    state.el_info[2].res_level = (short)uVar11;
    state.el_info[2].flags = (char)((uint)uVar11 >> 0x10);
    state.el_info[2]._3_1_ = (char)((uint)uVar11 >> 0x18);
    state.el_info[3].res_level = (short)uVar12;
    state.el_info[3].flags = (char)((uint)uVar12 >> 0x10);
    state.el_info[3]._3_1_ = (char)((uint)uVar12 >> 0x18);
    state.el_info[4].res_level = (short)uVar13;
    state.el_info[4].flags = (char)((uint)uVar13 >> 0x10);
    state.el_info[4]._3_1_ = (char)((uint)uVar13 >> 0x18);
    state.el_info[5].res_level = (short)uVar14;
    state.el_info[5].flags = (char)((uint)uVar14 >> 0x10);
    state.el_info[5]._3_1_ = (char)((uint)uVar14 >> 0x18);
    state.el_info[6].res_level = (short)uVar15;
    state.el_info[6].flags = (char)((uint)uVar15 >> 0x10);
    state.el_info[6]._3_1_ = (char)((uint)uVar15 >> 0x18);
    state.el_info[7].res_level = (short)uVar16;
    state.el_info[7].flags = (char)((uint)uVar16 >> 0x10);
    state.el_info[7]._3_1_ = (char)((uint)uVar16 >> 0x18);
    state.el_info[8].res_level = (short)uVar17;
    state.el_info[8].flags = (char)((uint)uVar17 >> 0x10);
    state.el_info[8]._3_1_ = (char)((uint)uVar17 >> 0x18);
    state.el_info[9].res_level = (short)uVar18;
    state.el_info[9].flags = (char)((uint)uVar18 >> 0x10);
    state.el_info[9]._3_1_ = (char)((uint)uVar18 >> 0x18);
    state.el_info[10].res_level = (short)uVar19;
    state.el_info[10].flags = (char)((uint)uVar19 >> 0x10);
    state.el_info[10]._3_1_ = (char)((uint)uVar19 >> 0x18);
    state.el_info[0xb].res_level = (short)uVar20;
    state.el_info[0xb].flags = (char)((uint)uVar20 >> 0x10);
    state.el_info[0xb]._3_1_ = (char)((uint)uVar20 >> 0x18);
    state.el_info[0xc].res_level = (short)uVar21;
    state.el_info[0xc].flags = (char)((uint)uVar21 >> 0x10);
    state.el_info[0xc]._3_1_ = (char)((uint)uVar21 >> 0x18);
    state.el_info[0xd].res_level = (short)uVar22;
    state.el_info[0xd].flags = (char)((uint)uVar22 >> 0x10);
    state.el_info[0xd]._3_1_ = (char)((uint)uVar22 >> 0x18);
    state.el_info[0xe].res_level = (short)uVar23;
    state.el_info[0xe].flags = (char)((uint)uVar23 >> 0x10);
    state.el_info[0xe]._3_1_ = (char)((uint)uVar23 >> 0x18);
    state.el_info[0xf].res_level = (short)uVar24;
    state.el_info[0xf].flags = (char)((uint)uVar24 >> 0x10);
    state.el_info[0xf]._3_1_ = (char)((uint)uVar24 >> 0x18);
    state.el_info[0x10].res_level = (short)uVar25;
    state.el_info[0x10].flags = (char)((uint)uVar25 >> 0x10);
    state.el_info[0x10]._3_1_ = (char)((uint)uVar25 >> 0x18);
    state.el_info[0x11].res_level = (short)uVar26;
    state.el_info[0x11].flags = (char)((uint)uVar26 >> 0x10);
    state.el_info[0x11]._3_1_ = (char)((uint)uVar26 >> 0x18);
    state.el_info[0x12].res_level = (short)uVar27;
    state.el_info[0x12].flags = (char)((uint)uVar27 >> 0x10);
    state.el_info[0x12]._3_1_ = (char)((uint)uVar27 >> 0x18);
    state.el_info[0x13].res_level = (short)uVar28;
    state.el_info[0x13].flags = (char)((uint)uVar28 >> 0x10);
    state.el_info[0x13]._3_1_ = (char)((uint)uVar28 >> 0x18);
    state.el_info[0x14].res_level = (short)uVar29;
    state.el_info[0x14].flags = (char)((uint)uVar29 >> 0x10);
    state.el_info[0x14]._3_1_ = (char)((uint)uVar29 >> 0x18);
    state.el_info[0x15].res_level = (short)uVar30;
    state.el_info[0x15].flags = (char)((uint)uVar30 >> 0x10);
    state.el_info[0x15]._3_1_ = (char)((uint)uVar30 >> 0x18);
    state.el_info[0x16].res_level = (short)uVar31;
    state.el_info[0x16].flags = (char)((uint)uVar31 >> 0x10);
    state.el_info[0x16]._3_1_ = (char)((uint)uVar31 >> 0x18);
    state.el_info[0x17].res_level = (short)uVar32;
    state.el_info[0x17].flags = (char)((uint)uVar32 >> 0x10);
    state.el_info[0x17]._3_1_ = (char)((uint)uVar32 >> 0x18);
    state.el_info[0x18].res_level = (short)uVar33;
    state.el_info[0x18].flags = (char)((uint)uVar33 >> 0x10);
    state.el_info[0x18]._3_1_ = (char)((uint)uVar33 >> 0x18);
    state.el_info[0x19].res_level = (short)uVar34;
    state.el_info[0x19].flags = (char)((uint)uVar34 >> 0x10);
    state.el_info[0x19]._3_1_ = (char)((uint)uVar34 >> 0x18);
    state.el_info[0x1a].res_level = (short)uVar35;
    state.el_info[0x1a].flags = (char)((uint)uVar35 >> 0x10);
    state.el_info[0x1a]._3_1_ = (char)((uint)uVar35 >> 0x18);
    state.el_info[0x1b].res_level = in_stack_fffffffffffffe18._310_2_;
    _Var2 = player_resists_effects(state,L'\x06');
    p = player;
    if (!_Var2) {
      uVar3 = Rand_div(5);
      player_inc_timed(p,L'\x02',uVar3 + L'\x04',true,(_Bool)((context->aware ^ 0xffU) & 1),true);
    }
  }
  context->ident = (_Bool)(bVar1 ^ 1);
  return true;
}

Assistant:

bool effect_handler_DARKEN_AREA(effect_handler_context_t *context)
{
	struct loc target = player->grid;
	bool message = player->timed[TMD_BLIND] ? false : true;
	struct monster *mon = NULL;
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);
	bool decoy_unseen = false;

	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
	}

	/* Check for monster targeting another monster */
	if (t_mon) {
		char m_name[80];
		target = t_mon->grid;
		monster_desc(m_name, sizeof(m_name), t_mon, MDESC_TARG);
		if (message) {
			msg("Darkness surrounds %s.", m_name);
			message = false;
		}
	}

	/* Check for decoy */
	if (mon && monster_is_decoyed(mon)) {
		target = decoy;
		if (!los(cave, player->grid, decoy) ||
			player->timed[TMD_BLIND]) {
			decoy_unseen = true;
		}
		if (message && !decoy_unseen) {
			msg("Darkness surrounds the decoy.");
			message = false;
		}
	}

	if (message) {
		msg("Darkness surrounds you.");
	}

	/* Darken the room */
	light_room(target, false);

	/* Hack - blind the player directly if player-cast */
	if (context->origin.what == SRC_PLAYER &&
		!player_resists_effects(player->state, ELEM_DARK)) {
		(void)player_inc_timed(player, TMD_BLIND, 3 + randint1(5), true,
							   !context->aware, true);
	}

	/* Assume seen */
	context->ident = !decoy_unseen;
	return (true);
}